

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

float __thiscall
tcu::Texture1DArrayView::sampleCompare
          (Texture1DArrayView *this,Sampler *sampler,float ref,float s,float t,float lod)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  int iVar1;
  float fVar2;
  IVec2 local_20;
  
  levels = this->m_levels;
  numLevels = this->m_numLevels;
  fVar2 = floorf(t + 0.5);
  iVar1 = (int)fVar2;
  local_20.m_data[1] = (levels->m_size).m_data[1] + -1;
  if (iVar1 < local_20.m_data[1]) {
    local_20.m_data[1] = iVar1;
  }
  if (iVar1 < 0) {
    local_20.m_data[1] = 0;
  }
  local_20.m_data[0] = 0;
  fVar2 = sampleLevelArray1DCompare(levels,numLevels,sampler,ref,s,lod,&local_20);
  return fVar2;
}

Assistant:

float Texture1DArrayView::sampleCompare (const Sampler& sampler, float ref, float s, float t, float lod) const
{
	return sampleLevelArray1DCompare(m_levels, m_numLevels, sampler, ref, s, lod, IVec2(0, selectLayer(t)));
}